

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O3

shared_ptr<Calculator> __thiscall
gurkenlaeufer::detail::ScenarioContext::getFixture<Calculator>(ScenarioContext *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Calculator *pCVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  *in_RSI;
  long *plVar6;
  undefined1 auVar7 [16];
  shared_ptr<Calculator> sVar8;
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> local_40;
  
  plVar6 = *(long **)in_RSI;
  plVar2 = *(long **)(in_RSI + 8);
  do {
    if (plVar6 == plVar2) {
      local_40.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &(local_40.
        super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &(local_40.
        super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_vptr__Sp_counted_base)->_M_ptr =
           (element_type *)&PTR___Sp_counted_ptr_inplace_00197f70;
      local_40.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (local_40.
                super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1);
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &local_40.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[1]._M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &local_40.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[2]._vptr__Sp_counted_base)->_M_ptr = (element_type *)0x0;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &local_40.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[2]._M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &local_40.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)&PTR__Fixture_00197fc0
      ;
      std::
      vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
      ::emplace_back<std::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>>&>(in_RSI,&local_40)
      ;
      pCVar4 = &(local_40.
                 super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_Calculator;
      if (local_40.
          super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        pCVar4 = (Calculator *)0x0;
      }
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar4;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_40.
                    super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      _Var5._M_pi = extraout_RDX;
LAB_00153d4b:
      sVar8.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      sVar8.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
      ;
      return (shared_ptr<Calculator>)
             sVar8.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*plVar6 == 0) {
LAB_00153ccc:
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      auVar7 = __dynamic_cast(*plVar6,&IFixture::typeinfo,&Calculator::typeinfo,0xfffffffffffffffe);
      _Var5._M_pi = auVar7._8_8_;
      if (auVar7._0_8_ == (pointer)0x0) goto LAB_00153ccc;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = auVar7._0_8_;
      psVar3 = (pointer)plVar6[1];
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar3;
      if (psVar3 == (pointer)0x0) goto LAB_00153d4b;
      if (__libc_single_threaded != '\0') {
        p_Var1 = &(psVar3->
                  super___shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        goto LAB_00153d4b;
      }
      LOCK();
      p_Var1 = &(psVar3->
                super___shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      if ((this->_fixtures).
          super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00153d4b;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->_fixtures).
                super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    plVar6 = plVar6 + 2;
  } while( true );
}

Assistant:

std::shared_ptr<T> getFixture()
        {
            for (auto& fixture : _fixtures) {
                auto ptr = std::dynamic_pointer_cast<T>(fixture);
                if (ptr != nullptr) {
                    return ptr;
                }
            }

            auto fixture = std::make_shared<Fixture<T>>();
            _fixtures.emplace_back(fixture);
            return fixture;
        }